

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_plain_scalar(yaml_parser_t *parser,yaml_token_t *token)

{
  yaml_mark_t *pyVar1;
  yaml_char_t *pyVar2;
  size_t sVar3;
  size_t sVar4;
  yaml_char_t *pyVar5;
  yaml_mark_t context_mark;
  yaml_mark_t context_mark_00;
  bool bVar6;
  int iVar7;
  int iVar8;
  yaml_char_t *pyVar9;
  bool bVar10;
  int local_e4;
  int local_e0;
  int local_dc;
  int indent;
  int leading_blanks;
  yaml_string_t whitespaces;
  yaml_string_t trailing_breaks;
  yaml_string_t leading_break;
  yaml_string_t string;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_token_t *token_local;
  yaml_parser_t *parser_local;
  
  memset(&leading_break.pointer,0,0x18);
  memset(&trailing_breaks.pointer,0,0x18);
  memset(&whitespaces.pointer,0,0x18);
  memset(&indent,0,0x18);
  bVar6 = false;
  iVar7 = parser->indent + 1;
  leading_break.pointer = (yaml_char_t *)yaml_malloc(0x10);
  if (leading_break.pointer == (yaml_char_t *)0x0) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    string.start = leading_break.pointer + 0x10;
    string.end = leading_break.pointer;
    memset(leading_break.pointer,0,0x10);
    trailing_breaks.pointer = (yaml_char_t *)yaml_malloc(0x10);
    if (trailing_breaks.pointer == (yaml_char_t *)0x0) {
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      leading_break.start = trailing_breaks.pointer + 0x10;
      leading_break.end = trailing_breaks.pointer;
      memset(trailing_breaks.pointer,0,0x10);
      whitespaces.pointer = (yaml_char_t *)yaml_malloc(0x10);
      if (whitespaces.pointer == (yaml_char_t *)0x0) {
        parser->error = YAML_MEMORY_ERROR;
      }
      else {
        trailing_breaks.start = whitespaces.pointer + 0x10;
        trailing_breaks.end = whitespaces.pointer;
        memset(whitespaces.pointer,0,0x10);
        _indent = (yaml_char_t *)yaml_malloc(0x10);
        if (_indent != (yaml_char_t *)0x0) {
          whitespaces.start = _indent + 0x10;
          whitespaces.end = _indent;
          memset(_indent,0,0x10);
          pyVar1 = &parser->mark;
          pyVar2 = (yaml_char_t *)pyVar1->index;
          sVar3 = (parser->mark).line;
          sVar4 = (parser->mark).column;
          context_mark_00 = *pyVar1;
          context_mark = *pyVar1;
          string.pointer = pyVar2;
          end_mark.index = sVar3;
          end_mark.line = sVar4;
          while( true ) {
            if ((parser->unread < 4) && (iVar8 = yaml_parser_update_buffer(parser,4), iVar8 == 0))
            goto LAB_002471b2;
            if (((((parser->mark).column == 0) &&
                 ((((*(parser->buffer).pointer == '-' && ((parser->buffer).pointer[1] == '-')) &&
                   ((parser->buffer).pointer[2] == '-')) ||
                  (((*(parser->buffer).pointer == '.' && ((parser->buffer).pointer[1] == '.')) &&
                   ((parser->buffer).pointer[2] == '.')))))) &&
                ((((((parser->buffer).pointer[3] == ' ' || ((parser->buffer).pointer[3] == '\t')) ||
                   ((((parser->buffer).pointer[3] == '\r' || ((parser->buffer).pointer[3] == '\n'))
                    || (((parser->buffer).pointer[3] == 0xc2 &&
                        ((parser->buffer).pointer[4] == 0x85)))))) ||
                  (((parser->buffer).pointer[3] == 0xe2 &&
                   (((parser->buffer).pointer[4] == 0x80 && ((parser->buffer).pointer[5] == 0xa8))))
                  )) || ((((parser->buffer).pointer[3] == 0xe2 &&
                          (((parser->buffer).pointer[4] == 0x80 &&
                           ((parser->buffer).pointer[5] == 0xa9)))) ||
                         ((parser->buffer).pointer[3] == '\0')))))) ||
               (*(parser->buffer).pointer == '#')) break;
            while( true ) {
              bVar10 = true;
              if ((((((*(parser->buffer).pointer != ' ') &&
                     (bVar10 = true, *(parser->buffer).pointer != '\t')) &&
                    (bVar10 = true, *(parser->buffer).pointer != '\r')) &&
                   (bVar10 = true, *(parser->buffer).pointer != '\n')) &&
                  (((*(parser->buffer).pointer != 0xc2 ||
                    (bVar10 = true, (parser->buffer).pointer[1] != 0x85)) &&
                   ((*(parser->buffer).pointer != 0xe2 ||
                    (((parser->buffer).pointer[1] != 0x80 ||
                     (bVar10 = true, (parser->buffer).pointer[2] != 0xa8)))))))) &&
                 ((*(parser->buffer).pointer != 0xe2 ||
                  (((parser->buffer).pointer[1] != 0x80 ||
                   (bVar10 = true, (parser->buffer).pointer[2] != 0xa9)))))) {
                bVar10 = *(parser->buffer).pointer == '\0';
              }
              if (bVar10) break;
              if (((parser->flow_level != 0) && (*(parser->buffer).pointer == ':')) &&
                 ((((parser->buffer).pointer[1] == ',' ||
                   ((((parser->buffer).pointer[1] == '?' || ((parser->buffer).pointer[1] == '[')) ||
                    ((parser->buffer).pointer[1] == ']')))) ||
                  (((parser->buffer).pointer[1] == '{' || ((parser->buffer).pointer[1] == '}'))))))
              {
                yaml_parser_set_scanner_error
                          (parser,"while scanning a plain scalar",context_mark,
                           "found unexpected \':\'");
                goto LAB_002471b2;
              }
              if (((*(parser->buffer).pointer == ':') &&
                  (((((((parser->buffer).pointer[1] == ' ' || ((parser->buffer).pointer[1] == '\t'))
                      || (((parser->buffer).pointer[1] == '\r' ||
                          ((parser->buffer).pointer[1] == '\n')))) ||
                     (((parser->buffer).pointer[1] == 0xc2 && ((parser->buffer).pointer[2] == 0x85))
                     )) || (((parser->buffer).pointer[1] == 0xe2 &&
                            (((parser->buffer).pointer[2] == 0x80 &&
                             ((parser->buffer).pointer[3] == 0xa8)))))) ||
                   ((((parser->buffer).pointer[1] == 0xe2 &&
                     (((parser->buffer).pointer[2] == 0x80 && ((parser->buffer).pointer[3] == 0xa9))
                     )) || ((parser->buffer).pointer[1] == '\0')))))) ||
                 ((parser->flow_level != 0 &&
                  ((((*(parser->buffer).pointer == ',' || (*(parser->buffer).pointer == '?')) ||
                    (*(parser->buffer).pointer == '[')) ||
                   (((*(parser->buffer).pointer == ']' || (*(parser->buffer).pointer == '{')) ||
                    (*(parser->buffer).pointer == '}')))))))) break;
              if ((bVar6) || (_indent != whitespaces.end)) {
                if (bVar6) {
                  if (*trailing_breaks.pointer == '\n') {
                    if (*whitespaces.pointer == '\0') {
                      if ((string.start <= string.end + 5) &&
                         (iVar8 = yaml_string_extend(&leading_break.pointer,&string.end,
                                                     &string.start), iVar8 == 0)) {
                        parser->error = YAML_MEMORY_ERROR;
                        goto LAB_002471b2;
                      }
                      *string.end = ' ';
                      string.end = string.end + 1;
                    }
                    else {
                      iVar8 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                               &whitespaces.pointer,&trailing_breaks.end,
                                               &trailing_breaks.start);
                      if (iVar8 == 0) {
                        parser->error = YAML_MEMORY_ERROR;
                        goto LAB_002471b2;
                      }
                      trailing_breaks.end = whitespaces.pointer;
                      memset(whitespaces.pointer,0,
                             (long)trailing_breaks.start - (long)whitespaces.pointer);
                    }
                    leading_break.end = trailing_breaks.pointer;
                    memset(trailing_breaks.pointer,0,
                           (long)leading_break.start - (long)trailing_breaks.pointer);
                  }
                  else {
                    iVar8 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                             &trailing_breaks.pointer,&leading_break.end,
                                             &leading_break.start);
                    if (iVar8 == 0) {
                      parser->error = YAML_MEMORY_ERROR;
                      goto LAB_002471b2;
                    }
                    leading_break.end = trailing_breaks.pointer;
                    iVar8 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                             &whitespaces.pointer,&trailing_breaks.end,
                                             &trailing_breaks.start);
                    if (iVar8 == 0) {
                      parser->error = YAML_MEMORY_ERROR;
                      goto LAB_002471b2;
                    }
                    trailing_breaks.end = whitespaces.pointer;
                    leading_break.end = trailing_breaks.pointer;
                    memset(trailing_breaks.pointer,0,
                           (long)leading_break.start - (long)trailing_breaks.pointer);
                    trailing_breaks.end = whitespaces.pointer;
                    memset(whitespaces.pointer,0,
                           (long)trailing_breaks.start - (long)whitespaces.pointer);
                  }
                  bVar6 = false;
                }
                else {
                  iVar8 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                           (yaml_char_t **)&indent,&whitespaces.end,
                                           &whitespaces.start);
                  if (iVar8 == 0) {
                    parser->error = YAML_MEMORY_ERROR;
                    goto LAB_002471b2;
                  }
                  whitespaces.end = _indent;
                  memset(_indent,0,(long)whitespaces.start - (long)_indent);
                }
              }
              if ((string.start <= string.end + 5) &&
                 (iVar8 = yaml_string_extend(&leading_break.pointer,&string.end,&string.start),
                 iVar8 == 0)) {
                parser->error = YAML_MEMORY_ERROR;
                goto LAB_002471b2;
              }
              if ((*(parser->buffer).pointer & 0x80) == 0) {
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                *string.end = *pyVar5;
                string.end = string.end + 1;
              }
              else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                pyVar9 = string.end + 1;
                *string.end = *pyVar5;
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                string.end = string.end + 2;
                *pyVar9 = *pyVar5;
              }
              else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                *string.end = *pyVar5;
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                pyVar9 = string.end + 2;
                string.end[1] = *pyVar5;
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                string.end = string.end + 3;
                *pyVar9 = *pyVar5;
              }
              else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                *string.end = *pyVar5;
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                string.end[1] = *pyVar5;
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                pyVar9 = string.end + 3;
                string.end[2] = *pyVar5;
                pyVar5 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar5 + 1;
                string.end = string.end + 4;
                *pyVar9 = *pyVar5;
              }
              (parser->mark).index = (parser->mark).index + 1;
              (parser->mark).column = (parser->mark).column + 1;
              parser->unread = parser->unread - 1;
              string.pointer = (yaml_char_t *)(parser->mark).index;
              end_mark.index = (parser->mark).line;
              end_mark.line = (parser->mark).column;
              if ((parser->unread < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
              goto LAB_002471b2;
            }
            if (((((*(parser->buffer).pointer != ' ') && (*(parser->buffer).pointer != '\t')) &&
                 ((*(parser->buffer).pointer != '\r' && (*(parser->buffer).pointer != '\n')))) &&
                ((*(parser->buffer).pointer != 0xc2 || ((parser->buffer).pointer[1] != 0x85)))) &&
               (((*(parser->buffer).pointer != 0xe2 ||
                 (((parser->buffer).pointer[1] != 0x80 || ((parser->buffer).pointer[2] != 0xa8))))
                && ((*(parser->buffer).pointer != 0xe2 ||
                    (((parser->buffer).pointer[1] != 0x80 || ((parser->buffer).pointer[2] != 0xa9)))
                    ))))) break;
            if (parser->unread == 0) {
              iVar8 = yaml_parser_update_buffer(parser,1);
              goto joined_r0x00246134;
            }
            while( true ) {
              bVar10 = true;
              if ((((((*(parser->buffer).pointer != ' ') &&
                     (bVar10 = true, *(parser->buffer).pointer != '\t')) &&
                    (bVar10 = true, *(parser->buffer).pointer != '\r')) &&
                   (bVar10 = true, *(parser->buffer).pointer != '\n')) &&
                  (((*(parser->buffer).pointer != 0xc2 ||
                    (bVar10 = true, (parser->buffer).pointer[1] != 0x85)) &&
                   ((*(parser->buffer).pointer != 0xe2 ||
                    (((parser->buffer).pointer[1] != 0x80 ||
                     (bVar10 = true, (parser->buffer).pointer[2] != 0xa8)))))))) &&
                 ((bVar10 = false, *(parser->buffer).pointer == 0xe2 &&
                  (bVar10 = false, (parser->buffer).pointer[1] == 0x80)))) {
                bVar10 = (parser->buffer).pointer[2] == 0xa9;
              }
              if (!bVar10) break;
              if ((*(parser->buffer).pointer == ' ') || (*(parser->buffer).pointer == '\t')) {
                if ((bVar6) &&
                   (((int)(parser->mark).column < iVar7 && (*(parser->buffer).pointer == '\t')))) {
                  yaml_parser_set_scanner_error
                            (parser,"while scanning a plain scalar",context_mark_00,
                             "found a tab character that violate indentation");
                  goto LAB_002471b2;
                }
                if (bVar6) {
                  (parser->mark).index = (parser->mark).index + 1;
                  (parser->mark).column = (parser->mark).column + 1;
                  parser->unread = parser->unread - 1;
                  if ((*(parser->buffer).pointer & 0x80) == 0) {
                    local_dc = 1;
                  }
                  else {
                    if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                      local_e0 = 2;
                    }
                    else {
                      if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                        local_e4 = 3;
                      }
                      else {
                        local_e4 = 0;
                        if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                          local_e4 = 4;
                        }
                      }
                      local_e0 = local_e4;
                    }
                    local_dc = local_e0;
                  }
                  (parser->buffer).pointer = (parser->buffer).pointer + local_dc;
                }
                else {
                  if ((whitespaces.start <= whitespaces.end + 5) &&
                     (iVar8 = yaml_string_extend((yaml_char_t **)&indent,&whitespaces.end,
                                                 &whitespaces.start), iVar8 == 0)) {
                    parser->error = YAML_MEMORY_ERROR;
                    goto LAB_002471b2;
                  }
                  if ((*(parser->buffer).pointer & 0x80) == 0) {
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    *whitespaces.end = *pyVar5;
                    whitespaces.end = whitespaces.end + 1;
                  }
                  else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    pyVar9 = whitespaces.end + 1;
                    *whitespaces.end = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    whitespaces.end = whitespaces.end + 2;
                    *pyVar9 = *pyVar5;
                  }
                  else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    *whitespaces.end = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    pyVar9 = whitespaces.end + 2;
                    whitespaces.end[1] = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    whitespaces.end = whitespaces.end + 3;
                    *pyVar9 = *pyVar5;
                  }
                  else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    *whitespaces.end = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    whitespaces.end[1] = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    pyVar9 = whitespaces.end + 3;
                    whitespaces.end[2] = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    whitespaces.end = whitespaces.end + 4;
                    *pyVar9 = *pyVar5;
                  }
                  (parser->mark).index = (parser->mark).index + 1;
                  (parser->mark).column = (parser->mark).column + 1;
                  parser->unread = parser->unread - 1;
                }
              }
              else {
                if ((parser->unread < 2) &&
                   (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0)) goto LAB_002471b2;
                if (bVar6) {
                  if ((trailing_breaks.start <= trailing_breaks.end + 5) &&
                     (iVar8 = yaml_string_extend(&whitespaces.pointer,&trailing_breaks.end,
                                                 &trailing_breaks.start), iVar8 == 0)) {
                    parser->error = YAML_MEMORY_ERROR;
                    goto LAB_002471b2;
                  }
                  if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n'))
                  {
                    *trailing_breaks.end = '\n';
                    (parser->buffer).pointer = (parser->buffer).pointer + 2;
                    (parser->mark).index = (parser->mark).index + 2;
                    (parser->mark).column = 0;
                    (parser->mark).line = (parser->mark).line + 1;
                    parser->unread = parser->unread - 2;
                    trailing_breaks.end = trailing_breaks.end + 1;
                  }
                  else if ((*(parser->buffer).pointer == '\r') ||
                          (*(parser->buffer).pointer == '\n')) {
                    *trailing_breaks.end = '\n';
                    (parser->buffer).pointer = (parser->buffer).pointer + 1;
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = 0;
                    (parser->mark).line = (parser->mark).line + 1;
                    parser->unread = parser->unread - 1;
                    trailing_breaks.end = trailing_breaks.end + 1;
                  }
                  else if ((*(parser->buffer).pointer == 0xc2) &&
                          ((parser->buffer).pointer[1] == 0x85)) {
                    *trailing_breaks.end = '\n';
                    (parser->buffer).pointer = (parser->buffer).pointer + 2;
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = 0;
                    (parser->mark).line = (parser->mark).line + 1;
                    parser->unread = parser->unread - 1;
                    trailing_breaks.end = trailing_breaks.end + 1;
                  }
                  else if (((*(parser->buffer).pointer == 0xe2) &&
                           ((parser->buffer).pointer[1] == 0x80)) &&
                          (((parser->buffer).pointer[2] == 0xa8 ||
                           ((parser->buffer).pointer[2] == 0xa9)))) {
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    *trailing_breaks.end = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    pyVar9 = trailing_breaks.end + 2;
                    trailing_breaks.end[1] = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    trailing_breaks.end = trailing_breaks.end + 3;
                    *pyVar9 = *pyVar5;
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = 0;
                    (parser->mark).line = (parser->mark).line + 1;
                    parser->unread = parser->unread - 1;
                  }
                }
                else {
                  whitespaces.end = _indent;
                  memset(_indent,0,(long)whitespaces.start - (long)_indent);
                  if ((leading_break.start <= leading_break.end + 5) &&
                     (iVar8 = yaml_string_extend(&trailing_breaks.pointer,&leading_break.end,
                                                 &leading_break.start), iVar8 == 0)) {
                    parser->error = YAML_MEMORY_ERROR;
                    goto LAB_002471b2;
                  }
                  if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n'))
                  {
                    *leading_break.end = '\n';
                    (parser->buffer).pointer = (parser->buffer).pointer + 2;
                    (parser->mark).index = (parser->mark).index + 2;
                    (parser->mark).column = 0;
                    (parser->mark).line = (parser->mark).line + 1;
                    parser->unread = parser->unread - 2;
                    leading_break.end = leading_break.end + 1;
                  }
                  else if ((*(parser->buffer).pointer == '\r') ||
                          (*(parser->buffer).pointer == '\n')) {
                    *leading_break.end = '\n';
                    (parser->buffer).pointer = (parser->buffer).pointer + 1;
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = 0;
                    (parser->mark).line = (parser->mark).line + 1;
                    parser->unread = parser->unread - 1;
                    leading_break.end = leading_break.end + 1;
                  }
                  else if ((*(parser->buffer).pointer == 0xc2) &&
                          ((parser->buffer).pointer[1] == 0x85)) {
                    *leading_break.end = '\n';
                    (parser->buffer).pointer = (parser->buffer).pointer + 2;
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = 0;
                    (parser->mark).line = (parser->mark).line + 1;
                    parser->unread = parser->unread - 1;
                    leading_break.end = leading_break.end + 1;
                  }
                  else if (((*(parser->buffer).pointer == 0xe2) &&
                           ((parser->buffer).pointer[1] == 0x80)) &&
                          (((parser->buffer).pointer[2] == 0xa8 ||
                           ((parser->buffer).pointer[2] == 0xa9)))) {
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    *leading_break.end = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    pyVar9 = leading_break.end + 2;
                    leading_break.end[1] = *pyVar5;
                    pyVar5 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar5 + 1;
                    leading_break.end = leading_break.end + 3;
                    *pyVar9 = *pyVar5;
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = 0;
                    (parser->mark).line = (parser->mark).line + 1;
                    parser->unread = parser->unread - 1;
                  }
                  bVar6 = true;
                }
              }
              if (parser->unread == 0) {
                iVar8 = yaml_parser_update_buffer(parser,1);
joined_r0x00246134:
                if (iVar8 == 0) goto LAB_002471b2;
              }
            }
            if ((parser->flow_level == 0) && ((int)(parser->mark).column < iVar7)) break;
          }
          memset(token,0,0x50);
          token->type = YAML_SCALAR_TOKEN;
          (token->start_mark).index = (size_t)pyVar2;
          (token->start_mark).line = sVar3;
          (token->start_mark).column = sVar4;
          (token->end_mark).index = (size_t)string.pointer;
          (token->end_mark).line = end_mark.index;
          (token->end_mark).column = end_mark.line;
          (token->data).tag.handle = leading_break.pointer;
          (token->data).tag.suffix = string.end + -(long)leading_break.pointer;
          (token->data).scalar.style = YAML_PLAIN_SCALAR_STYLE;
          if (bVar6) {
            parser->simple_key_allowed = 1;
          }
          yaml_free(trailing_breaks.pointer);
          leading_break.start = (yaml_char_t *)0x0;
          leading_break.end = (yaml_char_t *)0x0;
          trailing_breaks.pointer = (yaml_char_t *)0x0;
          yaml_free(whitespaces.pointer);
          trailing_breaks.start = (yaml_char_t *)0x0;
          trailing_breaks.end = (yaml_char_t *)0x0;
          whitespaces.pointer = (yaml_char_t *)0x0;
          yaml_free(_indent);
          return 1;
        }
        parser->error = YAML_MEMORY_ERROR;
      }
    }
  }
LAB_002471b2:
  yaml_free(leading_break.pointer);
  string.start = (yaml_char_t *)0x0;
  string.end = (yaml_char_t *)0x0;
  leading_break.pointer = (yaml_char_t *)0x0;
  yaml_free(trailing_breaks.pointer);
  leading_break.start = (yaml_char_t *)0x0;
  leading_break.end = (yaml_char_t *)0x0;
  trailing_breaks.pointer = (yaml_char_t *)0x0;
  yaml_free(whitespaces.pointer);
  trailing_breaks.start = (yaml_char_t *)0x0;
  trailing_breaks.end = (yaml_char_t *)0x0;
  whitespaces.pointer = (yaml_char_t *)0x0;
  yaml_free(_indent);
  return 0;
}

Assistant:

static int
yaml_parser_scan_plain_scalar(yaml_parser_t *parser, yaml_token_t *token)
{
    yaml_mark_t start_mark;
    yaml_mark_t end_mark;
    yaml_string_t string = NULL_STRING;
    yaml_string_t leading_break = NULL_STRING;
    yaml_string_t trailing_breaks = NULL_STRING;
    yaml_string_t whitespaces = NULL_STRING;
    int leading_blanks = 0;
    int indent = parser->indent+1;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;
    if (!STRING_INIT(parser, leading_break, INITIAL_STRING_SIZE)) goto error;
    if (!STRING_INIT(parser, trailing_breaks, INITIAL_STRING_SIZE)) goto error;
    if (!STRING_INIT(parser, whitespaces, INITIAL_STRING_SIZE)) goto error;

    start_mark = end_mark = parser->mark;

    /* Consume the content of the plain scalar. */

    while (1)
    {
        /* Check for a document indicator. */

        if (!CACHE(parser, 4)) goto error;

        if (parser->mark.column == 0 &&
            ((CHECK_AT(parser->buffer, '-', 0) &&
              CHECK_AT(parser->buffer, '-', 1) &&
              CHECK_AT(parser->buffer, '-', 2)) ||
             (CHECK_AT(parser->buffer, '.', 0) &&
              CHECK_AT(parser->buffer, '.', 1) &&
              CHECK_AT(parser->buffer, '.', 2))) &&
            IS_BLANKZ_AT(parser->buffer, 3)) break;

        /* Check for a comment. */

        if (CHECK(parser->buffer, '#'))
            break;

        /* Consume non-blank characters. */

        while (!IS_BLANKZ(parser->buffer))
        {
            /* Check for "x:" + one of ',?[]{}' in the flow context. TODO: Fix the test "spec-08-13".
             * This is not completely according to the spec
             * See http://yaml.org/spec/1.1/#id907281 9.1.3. Plain
             */

            if (parser->flow_level
                    && CHECK(parser->buffer, ':')
                    && (
                        CHECK_AT(parser->buffer, ',', 1)
                        || CHECK_AT(parser->buffer, '?', 1)
                        || CHECK_AT(parser->buffer, '[', 1)
                        || CHECK_AT(parser->buffer, ']', 1)
                        || CHECK_AT(parser->buffer, '{', 1)
                        || CHECK_AT(parser->buffer, '}', 1)
                    )
                    ) {
                yaml_parser_set_scanner_error(parser, "while scanning a plain scalar",
                        start_mark, "found unexpected ':'");
                goto error;
            }

            /* Check for indicators that may end a plain scalar. */

            if ((CHECK(parser->buffer, ':') && IS_BLANKZ_AT(parser->buffer, 1))
                    || (parser->flow_level &&
                        (CHECK(parser->buffer, ',')
                         || CHECK(parser->buffer, '?') || CHECK(parser->buffer, '[')
                         || CHECK(parser->buffer, ']') || CHECK(parser->buffer, '{')
                         || CHECK(parser->buffer, '}'))))
                break;

            /* Check if we need to join whitespaces and breaks. */

            if (leading_blanks || whitespaces.start != whitespaces.pointer)
            {
                if (leading_blanks)
                {
                    /* Do we need to fold line breaks? */

                    if (leading_break.start[0] == '\n') {
                        if (trailing_breaks.start[0] == '\0') {
                            if (!STRING_EXTEND(parser, string)) goto error;
                            *(string.pointer++) = ' ';
                        }
                        else {
                            if (!JOIN(parser, string, trailing_breaks)) goto error;
                            CLEAR(parser, trailing_breaks);
                        }
                        CLEAR(parser, leading_break);
                    }
                    else {
                        if (!JOIN(parser, string, leading_break)) goto error;
                        if (!JOIN(parser, string, trailing_breaks)) goto error;
                        CLEAR(parser, leading_break);
                        CLEAR(parser, trailing_breaks);
                    }

                    leading_blanks = 0;
                }
                else
                {
                    if (!JOIN(parser, string, whitespaces)) goto error;
                    CLEAR(parser, whitespaces);
                }
            }

            /* Copy the character. */

            if (!READ(parser, string)) goto error;

            end_mark = parser->mark;

            if (!CACHE(parser, 2)) goto error;
        }

        /* Is it the end? */

        if (!(IS_BLANK(parser->buffer) || IS_BREAK(parser->buffer)))
            break;

        /* Consume blank characters. */

        if (!CACHE(parser, 1)) goto error;

        while (IS_BLANK(parser->buffer) || IS_BREAK(parser->buffer))
        {
            if (IS_BLANK(parser->buffer))
            {
                /* Check for tab character that abuse indentation. */

                if (leading_blanks && (int)parser->mark.column < indent
                        && IS_TAB(parser->buffer)) {
                    yaml_parser_set_scanner_error(parser, "while scanning a plain scalar",
                            start_mark, "found a tab character that violate indentation");
                    goto error;
                }

                /* Consume a space or a tab character. */

                if (!leading_blanks) {
                    if (!READ(parser, whitespaces)) goto error;
                }
                else {
                    SKIP(parser);
                }
            }
            else
            {
                if (!CACHE(parser, 2)) goto error;

                /* Check if it is a first line break. */

                if (!leading_blanks)
                {
                    CLEAR(parser, whitespaces);
                    if (!READ_LINE(parser, leading_break)) goto error;
                    leading_blanks = 1;
                }
                else
                {
                    if (!READ_LINE(parser, trailing_breaks)) goto error;
                }
            }
            if (!CACHE(parser, 1)) goto error;
        }

        /* Check indentation level. */

        if (!parser->flow_level && (int)parser->mark.column < indent)
            break;
    }

    /* Create a token. */

    SCALAR_TOKEN_INIT(*token, string.start, string.pointer-string.start,
            YAML_PLAIN_SCALAR_STYLE, start_mark, end_mark);

    /* Note that we change the 'simple_key_allowed' flag. */

    if (leading_blanks) {
        parser->simple_key_allowed = 1;
    }

    STRING_DEL(parser, leading_break);
    STRING_DEL(parser, trailing_breaks);
    STRING_DEL(parser, whitespaces);

    return 1;

error:
    STRING_DEL(parser, string);
    STRING_DEL(parser, leading_break);
    STRING_DEL(parser, trailing_breaks);
    STRING_DEL(parser, whitespaces);

    return 0;
}